

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx::
     BVHNIntersectorKHybrid<4,_4,_257,_false,_embree::avx::VirtualCurveIntersectorK<4>,_true>::
     occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray,
              TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  int iVar10;
  bool bVar11;
  long lVar12;
  undefined1 auVar13 [16];
  char cVar14;
  byte bVar15;
  undefined4 uVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  ulong *puVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  vint4 ai_1;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  vint4 ai;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  vint4 ai_3;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  vint4 ai_2;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  vint4 bi_7;
  undefined1 auVar38 [16];
  vint4 bi_4;
  undefined1 auVar39 [16];
  vint4 bi;
  undefined1 auVar40 [16];
  vint4 bi_2;
  undefined1 auVar41 [16];
  float fVar42;
  float fVar44;
  float fVar45;
  undefined1 auVar43 [16];
  float fVar46;
  float fVar47;
  float fVar50;
  float fVar51;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar52;
  float fVar53;
  float fVar56;
  float fVar57;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  NodeRef stack [244];
  size_t local_7d8;
  ulong local_7d0 [244];
  
  puVar20 = local_7d0;
  local_7d8 = root.ptr;
  fVar1 = *(float *)((long)&(tray->org).field_0 + k * 4);
  auVar60._4_4_ = fVar1;
  auVar60._0_4_ = fVar1;
  auVar60._8_4_ = fVar1;
  auVar60._12_4_ = fVar1;
  fVar2 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  auVar61._4_4_ = fVar2;
  auVar61._0_4_ = fVar2;
  auVar61._8_4_ = fVar2;
  auVar61._12_4_ = fVar2;
  fVar3 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar62._4_4_ = fVar3;
  auVar62._0_4_ = fVar3;
  auVar62._8_4_ = fVar3;
  auVar62._12_4_ = fVar3;
  fVar4 = *(float *)((long)&(tray->dir).field_0 + k * 4);
  fVar5 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x10);
  fVar6 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  fVar7 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar8 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar9 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar24 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar19 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar23 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar10 = (tray->tnear).field_0.i[k];
  auVar40._4_4_ = iVar10;
  auVar40._0_4_ = iVar10;
  auVar40._8_4_ = iVar10;
  auVar40._12_4_ = iVar10;
  iVar10 = (tray->tfar).field_0.i[k];
  auVar41._4_4_ = iVar10;
  auVar41._0_4_ = iVar10;
  auVar41._8_4_ = iVar10;
  auVar41._12_4_ = iVar10;
LAB_00340ced:
  bVar11 = puVar20 != &local_7d8;
  if (puVar20 == &local_7d8) {
    return bVar11;
  }
  uVar21 = puVar20[-1];
  puVar20 = puVar20 + -1;
LAB_00340d01:
  if ((uVar21 & 0xf) == 0) {
    auVar13 = vsubps_avx(*(undefined1 (*) [16])(uVar21 + 0x20 + uVar24),auVar60);
    auVar25._0_4_ = fVar7 * auVar13._0_4_;
    auVar25._4_4_ = fVar7 * auVar13._4_4_;
    auVar25._8_4_ = fVar7 * auVar13._8_4_;
    auVar25._12_4_ = fVar7 * auVar13._12_4_;
    auVar13 = vsubps_avx(*(undefined1 (*) [16])(uVar21 + 0x20 + uVar19),auVar61);
    auVar29._0_4_ = fVar8 * auVar13._0_4_;
    auVar29._4_4_ = fVar8 * auVar13._4_4_;
    auVar29._8_4_ = fVar8 * auVar13._8_4_;
    auVar29._12_4_ = fVar8 * auVar13._12_4_;
    auVar13 = vpmaxsd_avx(auVar25,auVar29);
    auVar48 = vsubps_avx(*(undefined1 (*) [16])(uVar21 + 0x20 + uVar23),auVar62);
    auVar30._0_4_ = fVar9 * auVar48._0_4_;
    auVar30._4_4_ = fVar9 * auVar48._4_4_;
    auVar30._8_4_ = fVar9 * auVar48._8_4_;
    auVar30._12_4_ = fVar9 * auVar48._12_4_;
    auVar48 = vsubps_avx(*(undefined1 (*) [16])(uVar21 + 0x20 + (uVar24 ^ 0x10)),auVar60);
    auVar33._0_4_ = fVar7 * auVar48._0_4_;
    auVar33._4_4_ = fVar7 * auVar48._4_4_;
    auVar33._8_4_ = fVar7 * auVar48._8_4_;
    auVar33._12_4_ = fVar7 * auVar48._12_4_;
    auVar48 = vsubps_avx(*(undefined1 (*) [16])(uVar21 + 0x20 + (uVar19 ^ 0x10)),auVar61);
    auVar35._0_4_ = fVar8 * auVar48._0_4_;
    auVar35._4_4_ = fVar8 * auVar48._4_4_;
    auVar35._8_4_ = fVar8 * auVar48._8_4_;
    auVar35._12_4_ = fVar8 * auVar48._12_4_;
    auVar28 = vpminsd_avx(auVar33,auVar35);
    auVar48 = vsubps_avx(*(undefined1 (*) [16])(uVar21 + 0x20 + (uVar23 ^ 0x10)),auVar62);
    auVar36._0_4_ = fVar9 * auVar48._0_4_;
    auVar36._4_4_ = fVar9 * auVar48._4_4_;
    auVar36._8_4_ = fVar9 * auVar48._8_4_;
    auVar36._12_4_ = fVar9 * auVar48._12_4_;
    auVar48 = vpmaxsd_avx(auVar30,auVar40);
    auVar13 = vpmaxsd_avx(auVar13,auVar48);
    auVar48 = vpminsd_avx(auVar36,auVar41);
    auVar48 = vpminsd_avx(auVar28,auVar48);
    auVar13 = vpcmpgtd_avx(auVar13,auVar48);
    uVar16 = vmovmskps_avx(auVar13);
    bVar15 = (byte)uVar16 ^ 0xf;
  }
  else {
    if ((int)(uVar21 & 0xf) != 2) {
      cVar14 = (**(code **)((long)This->leafIntersector +
                           (ulong)*(byte *)(uVar21 & 0xfffffffffffffff0) * 0x40 + 0x18))
                         (pre,ray,k,context);
      if (cVar14 != '\0') {
        *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
        return bVar11;
      }
      goto LAB_00340ced;
    }
    uVar22 = uVar21 & 0xfffffffffffffff0;
    auVar48._0_4_ =
         *(float *)(uVar22 + 0x50) * fVar5 + fVar6 * *(float *)(uVar22 + 0x80) +
         fVar4 * *(float *)(uVar22 + 0x20);
    auVar48._4_4_ =
         *(float *)(uVar22 + 0x54) * fVar5 + fVar6 * *(float *)(uVar22 + 0x84) +
         fVar4 * *(float *)(uVar22 + 0x24);
    auVar48._8_4_ =
         *(float *)(uVar22 + 0x58) * fVar5 + fVar6 * *(float *)(uVar22 + 0x88) +
         fVar4 * *(float *)(uVar22 + 0x28);
    auVar48._12_4_ =
         *(float *)(uVar22 + 0x5c) * fVar5 + fVar6 * *(float *)(uVar22 + 0x8c) +
         fVar4 * *(float *)(uVar22 + 0x2c);
    auVar54._0_4_ =
         fVar5 * *(float *)(uVar22 + 0x60) + fVar6 * *(float *)(uVar22 + 0x90) +
         fVar4 * *(float *)(uVar22 + 0x30);
    auVar54._4_4_ =
         fVar5 * *(float *)(uVar22 + 100) + fVar6 * *(float *)(uVar22 + 0x94) +
         fVar4 * *(float *)(uVar22 + 0x34);
    auVar54._8_4_ =
         fVar5 * *(float *)(uVar22 + 0x68) + fVar6 * *(float *)(uVar22 + 0x98) +
         fVar4 * *(float *)(uVar22 + 0x38);
    auVar54._12_4_ =
         fVar5 * *(float *)(uVar22 + 0x6c) + fVar6 * *(float *)(uVar22 + 0x9c) +
         fVar4 * *(float *)(uVar22 + 0x3c);
    auVar43._0_4_ =
         fVar6 * *(float *)(uVar22 + 0xa0) + fVar5 * *(float *)(uVar22 + 0x70) +
         fVar4 * *(float *)(uVar22 + 0x40);
    auVar43._4_4_ =
         fVar6 * *(float *)(uVar22 + 0xa4) + fVar5 * *(float *)(uVar22 + 0x74) +
         fVar4 * *(float *)(uVar22 + 0x44);
    auVar43._8_4_ =
         fVar6 * *(float *)(uVar22 + 0xa8) + fVar5 * *(float *)(uVar22 + 0x78) +
         fVar4 * *(float *)(uVar22 + 0x48);
    auVar43._12_4_ =
         fVar6 * *(float *)(uVar22 + 0xac) + fVar5 * *(float *)(uVar22 + 0x7c) +
         fVar4 * *(float *)(uVar22 + 0x4c);
    auVar26._8_4_ = 0x7fffffff;
    auVar26._0_8_ = 0x7fffffff7fffffff;
    auVar26._12_4_ = 0x7fffffff;
    auVar13 = vandps_avx(auVar48,auVar26);
    auVar31._8_4_ = 0x219392ef;
    auVar31._0_8_ = 0x219392ef219392ef;
    auVar31._12_4_ = 0x219392ef;
    auVar13 = vcmpps_avx(auVar13,auVar31,1);
    auVar48 = vblendvps_avx(auVar48,auVar31,auVar13);
    auVar13 = vandps_avx(auVar54,auVar26);
    auVar13 = vcmpps_avx(auVar13,auVar31,1);
    auVar28 = vblendvps_avx(auVar54,auVar31,auVar13);
    auVar13 = vandps_avx(auVar43,auVar26);
    auVar13 = vcmpps_avx(auVar13,auVar31,1);
    auVar13 = vblendvps_avx(auVar43,auVar31,auVar13);
    auVar26 = vrcpps_avx(auVar48);
    fVar42 = auVar26._0_4_;
    auVar49._0_4_ = fVar42 * auVar48._0_4_;
    fVar44 = auVar26._4_4_;
    auVar49._4_4_ = fVar44 * auVar48._4_4_;
    fVar45 = auVar26._8_4_;
    auVar49._8_4_ = fVar45 * auVar48._8_4_;
    fVar46 = auVar26._12_4_;
    auVar49._12_4_ = fVar46 * auVar48._12_4_;
    auVar27._8_4_ = 0x3f800000;
    auVar27._0_8_ = 0x3f8000003f800000;
    auVar27._12_4_ = 0x3f800000;
    auVar48 = vsubps_avx(auVar27,auVar49);
    fVar42 = fVar42 + fVar42 * auVar48._0_4_;
    fVar44 = fVar44 + fVar44 * auVar48._4_4_;
    fVar45 = fVar45 + fVar45 * auVar48._8_4_;
    fVar46 = fVar46 + fVar46 * auVar48._12_4_;
    auVar48 = vrcpps_avx(auVar28);
    fVar47 = auVar48._0_4_;
    auVar55._0_4_ = fVar47 * auVar28._0_4_;
    fVar50 = auVar48._4_4_;
    auVar55._4_4_ = fVar50 * auVar28._4_4_;
    fVar51 = auVar48._8_4_;
    auVar55._8_4_ = fVar51 * auVar28._8_4_;
    fVar52 = auVar48._12_4_;
    auVar55._12_4_ = fVar52 * auVar28._12_4_;
    auVar48 = vsubps_avx(auVar27,auVar55);
    fVar47 = fVar47 + fVar47 * auVar48._0_4_;
    fVar50 = fVar50 + fVar50 * auVar48._4_4_;
    fVar51 = fVar51 + fVar51 * auVar48._8_4_;
    fVar52 = fVar52 + fVar52 * auVar48._12_4_;
    auVar48 = vrcpps_avx(auVar13);
    fVar53 = auVar48._0_4_;
    auVar59._0_4_ = fVar53 * auVar13._0_4_;
    fVar56 = auVar48._4_4_;
    auVar59._4_4_ = fVar56 * auVar13._4_4_;
    fVar57 = auVar48._8_4_;
    auVar59._8_4_ = fVar57 * auVar13._8_4_;
    fVar58 = auVar48._12_4_;
    auVar59._12_4_ = fVar58 * auVar13._12_4_;
    auVar13 = vsubps_avx(auVar27,auVar59);
    fVar53 = fVar53 + fVar53 * auVar13._0_4_;
    fVar56 = fVar56 + fVar56 * auVar13._4_4_;
    fVar57 = fVar57 + fVar57 * auVar13._8_4_;
    fVar58 = fVar58 + fVar58 * auVar13._12_4_;
    auVar34._0_4_ =
         (fVar1 * *(float *)(uVar22 + 0x20) +
         fVar2 * *(float *)(uVar22 + 0x50) +
         fVar3 * *(float *)(uVar22 + 0x80) + *(float *)(uVar22 + 0xb0)) * -fVar42;
    auVar34._4_4_ =
         (fVar1 * *(float *)(uVar22 + 0x24) +
         fVar2 * *(float *)(uVar22 + 0x54) +
         fVar3 * *(float *)(uVar22 + 0x84) + *(float *)(uVar22 + 0xb4)) * -fVar44;
    auVar34._8_4_ =
         (fVar1 * *(float *)(uVar22 + 0x28) +
         fVar2 * *(float *)(uVar22 + 0x58) +
         fVar3 * *(float *)(uVar22 + 0x88) + *(float *)(uVar22 + 0xb8)) * -fVar45;
    auVar34._12_4_ =
         (fVar1 * *(float *)(uVar22 + 0x2c) +
         fVar2 * *(float *)(uVar22 + 0x5c) +
         fVar3 * *(float *)(uVar22 + 0x8c) + *(float *)(uVar22 + 0xbc)) * -fVar46;
    auVar32._0_4_ =
         (fVar1 * *(float *)(uVar22 + 0x30) +
         fVar2 * *(float *)(uVar22 + 0x60) +
         fVar3 * *(float *)(uVar22 + 0x90) + *(float *)(uVar22 + 0xc0)) * -fVar47;
    auVar32._4_4_ =
         (fVar1 * *(float *)(uVar22 + 0x34) +
         fVar2 * *(float *)(uVar22 + 100) +
         fVar3 * *(float *)(uVar22 + 0x94) + *(float *)(uVar22 + 0xc4)) * -fVar50;
    auVar32._8_4_ =
         (fVar1 * *(float *)(uVar22 + 0x38) +
         fVar2 * *(float *)(uVar22 + 0x68) +
         fVar3 * *(float *)(uVar22 + 0x98) + *(float *)(uVar22 + 200)) * -fVar51;
    auVar32._12_4_ =
         (fVar1 * *(float *)(uVar22 + 0x3c) +
         fVar2 * *(float *)(uVar22 + 0x6c) +
         fVar3 * *(float *)(uVar22 + 0x9c) + *(float *)(uVar22 + 0xcc)) * -fVar52;
    auVar28._0_4_ =
         (fVar1 * *(float *)(uVar22 + 0x40) +
         fVar2 * *(float *)(uVar22 + 0x70) +
         fVar3 * *(float *)(uVar22 + 0xa0) + *(float *)(uVar22 + 0xd0)) * -fVar53;
    auVar28._4_4_ =
         (fVar1 * *(float *)(uVar22 + 0x44) +
         fVar2 * *(float *)(uVar22 + 0x74) +
         fVar3 * *(float *)(uVar22 + 0xa4) + *(float *)(uVar22 + 0xd4)) * -fVar56;
    auVar28._8_4_ =
         (fVar1 * *(float *)(uVar22 + 0x48) +
         fVar2 * *(float *)(uVar22 + 0x78) +
         fVar3 * *(float *)(uVar22 + 0xa8) + *(float *)(uVar22 + 0xd8)) * -fVar57;
    auVar28._12_4_ =
         (fVar1 * *(float *)(uVar22 + 0x4c) +
         fVar2 * *(float *)(uVar22 + 0x7c) +
         fVar3 * *(float *)(uVar22 + 0xac) + *(float *)(uVar22 + 0xdc)) * -fVar58;
    auVar37._0_4_ = fVar42 + auVar34._0_4_;
    auVar37._4_4_ = fVar44 + auVar34._4_4_;
    auVar37._8_4_ = fVar45 + auVar34._8_4_;
    auVar37._12_4_ = fVar46 + auVar34._12_4_;
    auVar38._0_4_ = fVar47 + auVar32._0_4_;
    auVar38._4_4_ = fVar50 + auVar32._4_4_;
    auVar38._8_4_ = fVar51 + auVar32._8_4_;
    auVar38._12_4_ = fVar52 + auVar32._12_4_;
    auVar39._0_4_ = fVar53 + auVar28._0_4_;
    auVar39._4_4_ = fVar56 + auVar28._4_4_;
    auVar39._8_4_ = fVar57 + auVar28._8_4_;
    auVar39._12_4_ = fVar58 + auVar28._12_4_;
    auVar13 = vpminsd_avx(auVar32,auVar38);
    auVar48 = vpminsd_avx(auVar28,auVar39);
    auVar13 = vmaxps_avx(auVar13,auVar48);
    auVar27 = vpminsd_avx(auVar34,auVar37);
    auVar26 = vpmaxsd_avx(auVar34,auVar37);
    auVar48 = vpmaxsd_avx(auVar32,auVar38);
    auVar28 = vpmaxsd_avx(auVar28,auVar39);
    auVar28 = vminps_avx(auVar48,auVar28);
    auVar48 = vmaxps_avx(auVar40,auVar27);
    auVar13 = vmaxps_avx(auVar48,auVar13);
    auVar48 = vminps_avx(auVar41,auVar26);
    auVar48 = vminps_avx(auVar48,auVar28);
    auVar13 = vcmpps_avx(auVar13,auVar48,2);
    uVar16 = vmovmskps_avx(auVar13);
    bVar15 = (byte)uVar16;
  }
  if (bVar15 == 0) goto LAB_00340ced;
  uVar22 = uVar21 & 0xfffffffffffffff0;
  lVar12 = 0;
  if (bVar15 != 0) {
    for (; (bVar15 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
    }
  }
  uVar21 = *(ulong *)(uVar22 + lVar12 * 8);
  uVar18 = bVar15 - 1 & (uint)bVar15;
  if (uVar18 != 0) {
    *puVar20 = uVar21;
    puVar20 = puVar20 + 1;
    lVar12 = 0;
    if (uVar18 != 0) {
      for (; (uVar18 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
      }
    }
    uVar21 = *(ulong *)(uVar22 + lVar12 * 8);
    uVar18 = uVar18 - 1 & uVar18;
    uVar17 = (ulong)uVar18;
    if (uVar18 != 0) {
      do {
        *puVar20 = uVar21;
        puVar20 = puVar20 + 1;
        lVar12 = 0;
        if (uVar17 != 0) {
          for (; (uVar17 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
          }
        }
        uVar21 = *(ulong *)(uVar22 + lVar12 * 8);
        uVar17 = uVar17 & uVar17 - 1;
      } while (uVar17 != 0);
    }
  }
  goto LAB_00340d01;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }